

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O0

bool __thiscall
Rml::FilterDropShadow::Initialise
          (FilterDropShadow *this,Colourb in_color,NumericValue in_offset_x,NumericValue in_offset_y
          ,NumericValue in_sigma)

{
  bool bVar1;
  Units UVar2;
  bool local_31;
  FilterDropShadow *this_local;
  Units UStack_20;
  NumericValue in_sigma_local;
  NumericValue in_offset_y_local;
  NumericValue in_offset_x_local;
  Colourb in_color_local;
  
  this->color = in_color;
  this->value_offset_x = in_offset_x;
  this->value_offset_y = in_offset_y;
  this->value_sigma = in_sigma;
  in_offset_y_local.unit = in_offset_x.unit;
  UVar2 = operator&(in_offset_y_local.unit,LENGTH);
  bVar1 = Any(UVar2);
  local_31 = false;
  if (bVar1) {
    in_sigma_local.unit = in_offset_y.unit;
    UVar2 = operator&(in_sigma_local.unit,LENGTH);
    bVar1 = Any(UVar2);
    local_31 = false;
    if (bVar1) {
      UStack_20 = in_sigma.unit;
      UVar2 = operator&(UStack_20,LENGTH);
      local_31 = Any(UVar2);
    }
  }
  return local_31;
}

Assistant:

bool FilterDropShadow::Initialise(Colourb in_color, NumericValue in_offset_x, NumericValue in_offset_y, NumericValue in_sigma)
{
	color = in_color;
	value_offset_x = in_offset_x;
	value_offset_y = in_offset_y;
	value_sigma = in_sigma;
	return Any(in_offset_x.unit & Unit::LENGTH) && Any(in_offset_y.unit & Unit::LENGTH) && Any(in_sigma.unit & Unit::LENGTH);
}